

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall
irr::video::CNullDriver::runOcclusionQuery(CNullDriver *this,ISceneNode *node,bool visible)

{
  s32 sVar1;
  uint uVar2;
  int iVar3;
  SOccQuery *pSVar4;
  undefined8 uVar5;
  undefined4 extraout_var;
  byte in_DL;
  long *in_RSI;
  long *in_RDI;
  u32 i;
  IMesh *mesh;
  SMaterial mat;
  s32 index;
  u32 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  uint uVar6;
  uint uVar7;
  array<irr::video::CNullDriver::SOccQuery> *in_stack_ffffffffffffff08;
  IMesh *pIVar8;
  undefined1 local_f0 [161];
  undefined1 local_4f;
  ushort local_4e;
  ushort local_40;
  int local_18;
  byte local_11;
  long *local_10;
  
  local_11 = in_DL & 1;
  if (in_RSI != (long *)0x0) {
    local_10 = in_RSI;
    SOccQuery::SOccQuery
              ((SOccQuery *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (ISceneNode *)(in_RDI + 6),
               (IMesh *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    sVar1 = core::array<irr::video::CNullDriver::SOccQuery>::linear_search
                      (in_stack_ffffffffffffff08,
                       (SOccQuery *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    SOccQuery::~SOccQuery
              ((SOccQuery *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (sVar1 != -1) {
      local_18 = sVar1;
      pSVar4 = core::array<irr::video::CNullDriver::SOccQuery>::operator[]
                         ((array<irr::video::CNullDriver::SOccQuery> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc);
      pSVar4->Run = 0;
      if ((local_11 & 1) == 0) {
        SMaterial::SMaterial((SMaterial *)CONCAT44(sVar1,in_stack_fffffffffffffef0));
        local_4f = 0;
        local_4e = local_4e & 0xfff0;
        local_40 = local_40 & 0xffc3;
        (**(code **)(*in_RDI + 0x60))(in_RDI,local_f0);
        SMaterial::~SMaterial((SMaterial *)CONCAT44(sVar1,in_stack_fffffffffffffef0));
      }
      uVar5 = (**(code **)(*local_10 + 0x50))();
      (**(code **)(*in_RDI + 0x30))(in_RDI,1,uVar5);
      pSVar4 = core::array<irr::video::CNullDriver::SOccQuery>::operator[]
                         ((array<irr::video::CNullDriver::SOccQuery> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc);
      pIVar8 = pSVar4->Mesh;
      uVar6 = 0;
      while (uVar7 = uVar6, uVar2 = (**pIVar8->_vptr_IMesh)(), uVar6 < uVar2) {
        if ((local_11 & 1) != 0) {
          iVar3 = (*pIVar8->_vptr_IMesh[1])(pIVar8,(ulong)uVar7);
          uVar5 = (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar3))();
          (**(code **)(*in_RDI + 0x60))(in_RDI,uVar5);
        }
        iVar3 = (*pIVar8->_vptr_IMesh[1])(pIVar8,(ulong)uVar7);
        (**(code **)(*in_RDI + 0x1b0))(in_RDI,iVar3);
        uVar6 = uVar7 + 1;
      }
    }
  }
  return;
}

Assistant:

void CNullDriver::runOcclusionQuery(scene::ISceneNode *node, bool visible)
{
	if (!node)
		return;
	s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index == -1)
		return;
	OcclusionQueries[index].Run = 0;
	if (!visible) {
		SMaterial mat;
		mat.Lighting = false;
		mat.AntiAliasing = 0;
		mat.ColorMask = ECP_NONE;
		mat.GouraudShading = false;
		mat.ZWriteEnable = EZW_OFF;
		setMaterial(mat);
	}
	setTransform(video::ETS_WORLD, node->getAbsoluteTransformation());
	const scene::IMesh *mesh = OcclusionQueries[index].Mesh;
	for (u32 i = 0; i < mesh->getMeshBufferCount(); ++i) {
		if (visible)
			setMaterial(mesh->getMeshBuffer(i)->getMaterial());
		drawMeshBuffer(mesh->getMeshBuffer(i));
	}
}